

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O0

void __thiscall cmGeneratedFileStreamBase::Open(cmGeneratedFileStreamBase *this,string *name)

{
  uint uVar1;
  ulong uVar2;
  undefined1 local_a0 [8];
  string dir;
  char local_78 [8];
  char buf [64];
  string *name_local;
  cmGeneratedFileStreamBase *this_local;
  
  cmsys::SystemTools::CollapseFullPath((string *)(buf + 0x38),name);
  std::__cxx11::string::operator=((string *)this,(string *)(buf + 0x38));
  std::__cxx11::string::~string((string *)(buf + 0x38));
  std::__cxx11::string::operator=((string *)&this->TempName,(string *)this);
  std::__cxx11::string::operator+=((string *)&this->TempName,".");
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)&this->TempName,(string *)&this->TempExt);
  }
  else {
    uVar1 = cmSystemTools::RandomSeed();
    snprintf(local_78,0x40,"tmp%05x",(ulong)(uVar1 & 0xfffff));
    std::__cxx11::string::operator+=((string *)&this->TempName,local_78);
  }
  dir.field_2._8_8_ = cmsys::SystemTools::RemoveFile(&this->TempName);
  cmsys::SystemTools::GetFilenamePath((string *)local_a0,&this->TempName);
  cmsys::SystemTools::MakeDirectory((string *)local_a0,(mode_t *)0x0);
  std::__cxx11::string::~string((string *)local_a0);
  return;
}

Assistant:

void cmGeneratedFileStreamBase::Open(std::string const& name)
{
  // Save the original name of the file.
  this->Name = cmSystemTools::CollapseFullPath(name);

  // Create the name of the temporary file.
  this->TempName = this->Name;
#if defined(__VMS)
  this->TempName += "_";
#else
  this->TempName += ".";
#endif
  if (!this->TempExt.empty()) {
    this->TempName += this->TempExt;
  } else {
    char buf[64];
    snprintf(buf, sizeof(buf), "tmp%05x",
             cmSystemTools::RandomSeed() & 0xFFFFF);
    this->TempName += buf;
  }

  // Make sure the temporary file that will be used is not present.
  cmSystemTools::RemoveFile(this->TempName);

  std::string dir = cmSystemTools::GetFilenamePath(this->TempName);
  cmSystemTools::MakeDirectory(dir);
}